

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# subject_utils.cpp
# Opt level: O3

Subject * bidfx_public_api::price::subject::SubjectUtils::CreateSubjectFromString
                    (Subject *__return_storage_ptr__,string *formatted_subject)

{
  SubjectBuilder builder;
  SubjectBuilder SStack_58;
  _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_40;
  
  SubjectBuilder::SubjectBuilder(&SStack_58);
  SubjectFormatter::SubjectFormatter((SubjectFormatter *)&local_40);
  SubjectFormatter::ParseSubject((SubjectFormatter *)&local_40,formatted_subject,&SStack_58);
  std::
  _Rb_tree<char,_std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<char>,_std::allocator<std::pair<const_char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_40);
  SubjectBuilder::CreateSubject(__return_storage_ptr__,&SStack_58);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&SStack_58.components_);
  return __return_storage_ptr__;
}

Assistant:

Subject SubjectUtils::CreateSubjectFromString(const std::string& formatted_subject)
{
    SubjectBuilder builder = SubjectBuilder();
    SubjectFormatter().ParseSubject(formatted_subject, builder);
    return builder.CreateSubject();
}